

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

double __thiscall slang::SVInt::pow(SVInt *this,double __x,double __y)

{
  uint bits;
  SVInt *pSVar1;
  byte bVar2;
  double dVar3;
  logic_t lVar4;
  bitwidth_t bVar5;
  bitwidth_t bVar6;
  undefined1 isSigned;
  SVInt *pSVar7;
  SVInt *in_RDX;
  uint64_t value;
  SVInt *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_50;
  uint local_48;
  byte local_43;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_40;
  uint local_38;
  byte local_33;
  
  if (((in_RSI->super_SVIntStorage).unknownFlag != false) ||
     ((in_RDX->super_SVIntStorage).unknownFlag == true)) {
LAB_002c5ad5:
    createFillX(this,(in_RSI->super_SVIntStorage).bitWidth,(in_RSI->super_SVIntStorage).signFlag);
    return extraout_XMM0_Qa;
  }
  bVar5 = getActiveBits(in_RSI);
  bVar6 = getActiveBits(in_RDX);
  if (bVar5 == 0) {
    if (bVar6 != 0) {
      if (((((in_RDX->super_SVIntStorage).signFlag == true) &&
           (lVar4 = operator[](in_RDX,(in_RDX->super_SVIntStorage).bitWidth - 1),
           lVar4.value != '\0')) && (lVar4.value != '@')) && (lVar4.value != 0x80))
      goto LAB_002c5ad5;
      bVar6 = (in_RSI->super_SVIntStorage).bitWidth;
      isSigned = (in_RSI->super_SVIntStorage).signFlag;
      goto LAB_002c5c3c;
    }
  }
  else if (bVar5 != 1 && bVar6 != 0) {
    isSigned = (in_RSI->super_SVIntStorage).signFlag;
    if ((bool)isSigned == true) {
      bVar6 = (in_RSI->super_SVIntStorage).bitWidth;
      lVar4 = operator[](in_RSI,bVar6 - 1);
      if ((((lVar4.value != '\0') && (lVar4.value != '@')) &&
          ((lVar4.value != 0x80 &&
           ((lVar4 = reductionAnd(in_RSI), lVar4.value != '\0' && (lVar4.value != '@')))))) &&
         (lVar4.value != 0x80)) {
        pSVar1 = (SVInt *)(in_RDX->super_SVIntStorage).field_0.val;
        pSVar7 = in_RDX;
        if (((in_RDX->super_SVIntStorage).unknownFlag & 1U) != 0) {
          pSVar7 = pSVar1;
        }
        if (0x40 < (in_RDX->super_SVIntStorage).bitWidth) {
          pSVar7 = pSVar1;
        }
        if (((ulong)(pSVar7->super_SVIntStorage).field_0 & 1) == 0) {
          value = 1;
        }
        else {
          value = 0xffffffffffffffff;
        }
        isSigned = true;
        goto LAB_002c5c54;
      }
    }
    if (((((in_RDX->super_SVIntStorage).signFlag != true) ||
         (lVar4 = operator[](in_RDX,(in_RDX->super_SVIntStorage).bitWidth - 1), lVar4.value == '\0')
         ) || (lVar4.value == '@')) || (lVar4.value == 0x80)) {
      if ((((bool)isSigned != false) &&
          (lVar4 = operator[](in_RSI,(in_RSI->super_SVIntStorage).bitWidth - 1), lVar4.value != '\0'
          )) && ((lVar4.value != '@' && (lVar4.value != 0x80)))) {
        pSVar1 = (SVInt *)(in_RDX->super_SVIntStorage).field_0.val;
        pSVar7 = in_RDX;
        if (((in_RDX->super_SVIntStorage).unknownFlag & 1U) != 0) {
          pSVar7 = pSVar1;
        }
        if (0x40 < (in_RDX->super_SVIntStorage).bitWidth) {
          pSVar7 = pSVar1;
        }
        if (((ulong)(pSVar7->super_SVIntStorage).field_0 & 1) == 0) {
          operator-((SVInt *)&local_50);
          modPow(this,(SVInt *)&local_50,in_RDX,(in_RSI->super_SVIntStorage).signFlag);
          dVar3 = extraout_XMM0_Qa_03;
          local_40 = local_50;
        }
        else {
          operator-((SVInt *)&local_40);
          modPow((SVInt *)&local_50,(SVInt *)&local_40,in_RDX,(in_RSI->super_SVIntStorage).signFlag)
          ;
          operator-(this);
          dVar3 = extraout_XMM0_Qa_05;
          if (((0x40 < local_48) ||
              (bVar2 = local_43 & 1, local_43 = local_33, local_48 = local_38, bVar2 != 0)) &&
             (local_43 = local_33, local_48 = local_38, (void *)local_50.val != (void *)0x0)) {
            operator_delete__(local_50.pVal);
            dVar3 = extraout_XMM0_Qa_06;
            local_43 = local_33;
            local_48 = local_38;
          }
        }
joined_r0x002c5d1f:
        if ((local_48 < 0x41) && ((local_43 & 1) == 0)) {
          return dVar3;
        }
        if ((void *)local_40.val == (void *)0x0) {
          return dVar3;
        }
        operator_delete__(local_40.pVal);
        return extraout_XMM0_Qa_04;
      }
      if (bVar5 == 2) {
        bits = (in_RSI->super_SVIntStorage).bitWidth;
        pSVar1 = (SVInt *)(in_RSI->super_SVIntStorage).field_0.val;
        pSVar7 = in_RSI;
        if (((in_RSI->super_SVIntStorage).unknownFlag & 1U) != 0) {
          pSVar7 = pSVar1;
        }
        if (0x40 < bits) {
          pSVar7 = pSVar1;
        }
        if ((pSVar7->super_SVIntStorage).field_0.val == 2) {
          SVInt((SVInt *)&local_50,bits,1,(bool)isSigned);
          shl(this,(SVInt *)&local_50);
          dVar3 = extraout_XMM0_Qa_00;
          local_40 = local_50;
          goto joined_r0x002c5d1f;
        }
      }
      modPow(this,in_RSI,in_RDX,(bool)isSigned);
      return extraout_XMM0_Qa_02;
    }
    bVar6 = (in_RSI->super_SVIntStorage).bitWidth;
LAB_002c5c3c:
    value = 0;
    goto LAB_002c5c54;
  }
  bVar6 = (in_RSI->super_SVIntStorage).bitWidth;
  isSigned = (in_RSI->super_SVIntStorage).signFlag;
  value = 1;
LAB_002c5c54:
  SVInt(this,bVar6,value,(bool)isSigned);
  return extraout_XMM0_Qa_01;
}

Assistant:

SVInt SVInt::pow(const SVInt& rhs) const {
    // ignore unknowns
    if (unknownFlag || rhs.unknownFlag)
        return createFillX(bitWidth, signFlag);

    // Handle special cases first (note that the result always has
    // the bit width of *this)
    bitwidth_t lhsBits = getActiveBits();
    bitwidth_t rhsBits = rhs.getActiveBits();
    // The second operand of the power operator shall be treated as self-determined
    if (lhsBits == 0) {
        if (rhsBits == 0) // 0**0 == 1
            return SVInt(bitWidth, 1, signFlag);
        if (rhs.signFlag && rhs.isNegative()) // 0**-y == x
            return createFillX(bitWidth, signFlag);
        // 0**y == 0
        return SVInt(bitWidth, 0, signFlag);
    }

    // x**0 == 1 || 1**y == 1
    if (rhsBits == 0 || lhsBits == 1)
        return SVInt(bitWidth, 1, signFlag);

    if (signFlag && isNegative()) {
        if (reductionAnd()) { // x == -1
            // if rhs is odd, result is -1
            // otherwise, result is 1
            if (rhs.isOdd())
                return SVInt(bitWidth, UINT64_MAX, signFlag);
            else
                return SVInt(bitWidth, 1, signFlag);
        }
    }

    if (rhs.signFlag && rhs.isNegative()) // x**-y == 0
        return SVInt(bitWidth, 0, signFlag);

    // we have one of two cases left (rhs is always positive here):
    // 1. lhs > 1 (just do the operation)
    // 2. lhs < -1 (invert, do the op, figure out the sign at the end)
    if (signFlag && isNegative()) {
        // result is negative if rhs is odd, otherwise positive
        if (rhs.isOdd())
            return -modPow(-(*this), rhs, signFlag);
        else
            return modPow(-(*this), rhs, signFlag);
    }

    // Optimization for the common case of 2**y
    if (lhsBits == 2 && getRawData()[0] == 2)
        return SVInt(bitWidth, 1, signFlag).shl(rhs);

    return modPow(*this, rhs, signFlag);
}